

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.h
# Opt level: O0

string * __thiscall
CoreML::Specification::Imputer::mutable_replacestringvalue_abi_cxx11_(Imputer *this)

{
  bool bVar1;
  string *psVar2;
  Imputer *this_local;
  
  bVar1 = has_replacestringvalue(this);
  if (!bVar1) {
    clear_ReplaceValue(this);
    set_has_replacestringvalue(this);
    psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
    google::protobuf::internal::ArenaStringPtr::UnsafeSetDefault
              (&(this->ReplaceValue_).replacestringvalue_,psVar2);
  }
  psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  psVar2 = google::protobuf::internal::ArenaStringPtr::MutableNoArena
                     (&(this->ReplaceValue_).replacestringvalue_,psVar2);
  return psVar2;
}

Assistant:

inline ::std::string* Imputer::mutable_replacestringvalue() {
  if (!has_replacestringvalue()) {
    clear_ReplaceValue();
    set_has_replacestringvalue();
    ReplaceValue_.replacestringvalue_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Imputer.replaceStringValue)
  return ReplaceValue_.replacestringvalue_.MutableNoArena(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
}